

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedNumberFormat::RuleBasedNumberFormat
          (RuleBasedNumberFormat *this,UnicodeString *description,UnicodeString *locs,
          Locale *alocale,UParseError *perror,UErrorCode *status)

{
  LocalizationInfo *locinfo;
  UErrorCode *status_local;
  UParseError *perror_local;
  Locale *alocale_local;
  UnicodeString *locs_local;
  UnicodeString *description_local;
  RuleBasedNumberFormat *this_local;
  
  NumberFormat::NumberFormat(&this->super_NumberFormat);
  (this->super_NumberFormat).super_Format.super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedNumberFormat_005bc1a8;
  this->fRuleSets = (NFRuleSet **)0x0;
  this->ruleSetDescriptions = (UnicodeString *)0x0;
  this->numRuleSets = 0;
  this->defaultRuleSet = (NFRuleSet *)0x0;
  Locale::Locale(&this->locale,alocale);
  this->collator = (RuleBasedCollator *)0x0;
  this->decimalFormatSymbols = (DecimalFormatSymbols *)0x0;
  this->defaultInfinityRule = (NFRule *)0x0;
  this->defaultNaNRule = (NFRule *)0x0;
  this->fRoundingMode = kRoundUnnecessary;
  this->lenient = '\0';
  this->lenientParseRules = (UnicodeString *)0x0;
  this->localizations = (LocalizationInfo *)0x0;
  icu_63::UnicodeString::UnicodeString(&this->originalDescription);
  this->capitalizationInfoSet = '\0';
  this->capitalizationForUIListMenu = '\0';
  this->capitalizationForStandAlone = '\0';
  this->capitalizationBrkIter = (BreakIterator *)0x0;
  StringLocalizationInfo::create(locs,perror,status);
  init(this,(EVP_PKEY_CTX *)description);
  return;
}

Assistant:

RuleBasedNumberFormat::RuleBasedNumberFormat(const UnicodeString& description, 
                                             const UnicodeString& locs,
                                             const Locale& alocale, UParseError& perror, UErrorCode& status)
  : fRuleSets(NULL)
  , ruleSetDescriptions(NULL)
  , numRuleSets(0)
  , defaultRuleSet(NULL)
  , locale(alocale)
  , collator(NULL)
  , decimalFormatSymbols(NULL)
  , defaultInfinityRule(NULL)
  , defaultNaNRule(NULL)
  , fRoundingMode(DecimalFormat::ERoundingMode::kRoundUnnecessary)
  , lenient(FALSE)
  , lenientParseRules(NULL)
  , localizations(NULL)
  , capitalizationInfoSet(FALSE)
  , capitalizationForUIListMenu(FALSE)
  , capitalizationForStandAlone(FALSE)
  , capitalizationBrkIter(NULL)
{
  LocalizationInfo* locinfo = StringLocalizationInfo::create(locs, perror, status);
  init(description, locinfo, perror, status);
}